

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

string * __thiscall
relive::ReLiveDB::getConfigValueString(ReLiveDB *this,string *key,string *defaultValue)

{
  bool bVar1;
  pointer pKVar2;
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  system_error *anon_var_0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  storage_t<_86c824a_> *in_stack_00000028;
  unique_ptr<relive::KeyValue,_std::default_delete<relive::KeyValue>_> kv;
  lock_guard<std::recursive_mutex> lock;
  string *this_00;
  string local_60 [64];
  string *local_20;
  string *local_18;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_RDI,(mutex_type *)in_RDI);
  storage_abi_cxx11_();
  std::__cxx11::string::string(local_60,local_18);
  sqlite_orm::internal::storage_t<$86c824a$>::
  get_pointer<relive::KeyValue,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (in_stack_00000028,in_stack_00000020);
  std::__cxx11::string::~string(local_60);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<relive::KeyValue,_std::default_delete<relive::KeyValue>_> *)
                     0x1f1987);
  if (bVar1) {
    pKVar2 = std::unique_ptr<relive::KeyValue,_std::default_delete<relive::KeyValue>_>::operator->
                       ((unique_ptr<relive::KeyValue,_std::default_delete<relive::KeyValue>_> *)
                        0x1f199a);
    std::__cxx11::string::string((string *)in_RDI,(string *)&pKVar2->value);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_20);
  }
  std::unique_ptr<relive::KeyValue,_std::default_delete<relive::KeyValue>_>::~unique_ptr
            ((unique_ptr<relive::KeyValue,_std::default_delete<relive::KeyValue>_> *)this_00);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1f1a91);
  return this_00;
}

Assistant:

std::string ReLiveDB::getConfigValueString(const std::string& key, const std::string& defaultValue)
{
    using namespace sqlite_orm;
    std::lock_guard<Mutex> lock{_mutex};
    try {
        if (auto kv = storage().get_pointer<KeyValue>(key)) {
            return kv->value;
        }
        else {
            return defaultValue;
        }
    }
    catch (const std::system_error&) {
        return defaultValue;
    }
}